

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oplintf.c
# Opt level: O0

UINT8 device_start_ym3526(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  DEV_DATA devData_00;
  UINT32 local_34;
  UINT32 rate;
  DEV_DATA *devData;
  void *chip;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  local_34 = cfg->clock / 0x48;
  if ((cfg->srMode == '\x01') || ((cfg->srMode == '\x02' && (local_34 < cfg->smplRate)))) {
    local_34 = cfg->smplRate;
  }
  devData_00.chipInf = ym3526_init(cfg->clock,local_34);
  if ((DEV_DATA *)devData_00.chipInf == (DEV_DATA *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    *(void **)devData_00.chipInf = devData_00.chipInf;
    INIT_DEVINF(retDevInf,(DEV_DATA *)devData_00.chipInf,local_34,&devDef3526_MAME);
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_ym3526(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 72;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = ym3526_init(cfg->clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	// YM3526 setup
	//ym3526_set_timer_handler (chip, TimerHandler, chip);
	//ym3526_set_irq_handler   (chip, IRQHandler, chip);
	//ym3526_set_update_handler(chip, stream_update3526, chip);
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef3526_MAME);
	return 0x00;
}